

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void speak_pa_finished_cold_1(void)

{
  char *pcVar1;
  long in_RDI;
  
  pcVar1 = anon_var_dwarf_a42;
  if (*(char *)(in_RDI + 0x23) != '\0') {
    pcVar1 = anon_var_dwarf_a2a;
  }
  fprintf(_stderr,"%s\n",pcVar1);
  return;
}

Assistant:

void console_message(const char *mes)
{
#if defined(_WIN32)
	char *temp = u8tosjis(mes);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	fprintf(stderr, temp);
	free(temp);
#else
	fprintf(stderr, "%s\n", mes);
#endif
}